

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_update.cpp
# Opt level: O0

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Binder::BindUpdateSet
          (Binder *this,LogicalOperator *op,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *root,UpdateSetInfo *set_info,TableCatalogEntry *table,
          vector<duckdb::PhysicalIndex,_true> *columns)

{
  ulong uVar1;
  idx_t table_00;
  bool bVar2;
  size_type sVar3;
  undefined8 uVar4;
  string *psVar5;
  pointer pEVar6;
  pointer src;
  long in_RDX;
  undefined8 in_RSI;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> in_RDI;
  long in_R8;
  ExpressionBinder *unaff_retaddr;
  optional_ptr<duckdb::LogicalType,_true> in_stack_00000008;
  templated_unique_single_t proj;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> bound_expr;
  UpdateBinder binder;
  ColumnDefinition *column;
  value_type *expr;
  value_type *colname;
  idx_t i;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  projection_expressions;
  idx_t proj_index;
  ColumnDefinition *in_stack_fffffffffffffc78;
  Binder *in_stack_fffffffffffffc80;
  LogicalOperator *this_00;
  Binder *in_stack_fffffffffffffc88;
  __normal_iterator<duckdb::PhysicalIndex_*,_std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>_>
  in_stack_fffffffffffffc90;
  __normal_iterator<duckdb::PhysicalIndex_*,_std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>_>
  in_stack_fffffffffffffc98;
  LogicalType *in_stack_fffffffffffffcb8;
  ColumnBinding *in_stack_fffffffffffffcd0;
  LogicalType *in_stack_fffffffffffffcd8;
  undefined7 in_stack_fffffffffffffce0;
  ExpressionType in_stack_fffffffffffffce7;
  BaseExpression *in_stack_fffffffffffffce8;
  Binder *in_stack_fffffffffffffcf0;
  unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
  local_268;
  undefined1 local_260 [48];
  undefined1 local_230 [144];
  idx_t local_1a0;
  undefined1 local_191;
  string local_190 [39];
  allocator local_169;
  string local_168 [32];
  PhysicalIndex *local_148;
  idx_t local_140;
  PhysicalIndex *local_138;
  PhysicalIndex *local_130;
  PhysicalIndex *local_128;
  undefined1 local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [32];
  ColumnDefinition *local_d0;
  undefined1 local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [32];
  LogicalType *local_78;
  reference local_60;
  ulong local_58;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_50 [24];
  idx_t local_38;
  long local_28;
  long local_18;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> expr_00;
  
  local_28 = in_R8;
  local_18 = in_RDX;
  expr_00._M_head_impl =
       (LogicalOperator *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  local_38 = GenerateTableIndex(in_stack_fffffffffffffc80);
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            *)0xdec864);
  local_58 = 0;
  while( true ) {
    uVar1 = local_58;
    sVar3 = ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_28 + 8));
    if (sVar3 <= uVar1) {
      if ((*(char *)(local_18 + 8) == 'f') ||
         (bVar2 = std::
                  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ::empty((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           *)in_stack_fffffffffffffc90._M_current), !bVar2)) {
        make_uniq<duckdb::LogicalProjection,unsigned_long&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
                  ((unsigned_long *)in_stack_fffffffffffffcd8,
                   (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)in_stack_fffffffffffffcd0);
        src = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
              ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                            *)in_stack_fffffffffffffc80);
        this_00 = (LogicalOperator *)local_260;
        unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
        unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)this_00,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)in_stack_fffffffffffffc78);
        LogicalOperator::AddChild
                  (this_00,(unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                            *)in_stack_fffffffffffffc78);
        unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
        ~unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                     *)0xded221);
        unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
        ::unique_ptr((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                      *)this_00,&local_268);
        unique_ptr_cast<duckdb::LogicalProjection,duckdb::LogicalOperator>
                  ((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                    *)src);
        unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
        ::~unique_ptr((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                       *)0xded25a);
        local_260._20_4_ = 1;
        unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
        ::~unique_ptr((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                       *)0xded272);
      }
      else {
        unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
        unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)in_stack_fffffffffffffc80,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)in_stack_fffffffffffffc78);
        local_260._20_4_ = 1;
      }
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 *)0xded2ea);
      return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
             (__uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
              )in_RDI._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    }
    local_60 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             *)in_stack_fffffffffffffc80,(size_type)in_stack_fffffffffffffc78);
    local_78 = (LogicalType *)
               vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                             *)in_stack_fffffffffffffc80,(size_type)in_stack_fffffffffffffc78);
    bVar2 = TableCatalogEntry::ColumnExists
                      ((TableCatalogEntry *)in_stack_fffffffffffffc80,
                       &in_stack_fffffffffffffc78->name);
    if (!bVar2) {
      local_c1 = 1;
      uVar4 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_98,"Referenced update column %s not found in table!",&local_99);
      ::std::__cxx11::string::string(local_c0,(string *)local_60);
      BinderException::BinderException<std::__cxx11::string>
                ((BinderException *)in_stack_fffffffffffffcf0,(string *)in_stack_fffffffffffffce8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
      local_c1 = 0;
      __cxa_throw(uVar4,&BinderException::typeinfo,BinderException::~BinderException);
    }
    local_d0 = TableCatalogEntry::GetColumn
                         ((TableCatalogEntry *)in_stack_fffffffffffffc80,
                          &in_stack_fffffffffffffc78->name);
    bVar2 = ColumnDefinition::Generated(local_d0);
    if (bVar2) {
      local_119 = 1;
      uVar4 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_f0,"Cant update column \"%s\" because it is a generated column!",&local_f1);
      psVar5 = ColumnDefinition::Name_abi_cxx11_(local_d0);
      ::std::__cxx11::string::string(local_118,(string *)psVar5);
      BinderException::BinderException<std::__cxx11::string>
                ((BinderException *)in_stack_fffffffffffffcf0,(string *)in_stack_fffffffffffffce8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
      local_119 = 0;
      __cxa_throw(uVar4,&BinderException::typeinfo,BinderException::~BinderException);
    }
    local_130 = (PhysicalIndex *)
                ::std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::begin
                          ((vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_> *)
                           in_stack_fffffffffffffc78);
    local_138 = (PhysicalIndex *)
                ::std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::end
                          ((vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_> *)
                           in_stack_fffffffffffffc78);
    local_140 = (idx_t)ColumnDefinition::Physical(in_stack_fffffffffffffc78);
    local_128 = (PhysicalIndex *)
                ::std::
                find<__gnu_cxx::__normal_iterator<duckdb::PhysicalIndex*,std::vector<duckdb::PhysicalIndex,std::allocator<duckdb::PhysicalIndex>>>,duckdb::PhysicalIndex>
                          (in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                           (PhysicalIndex *)in_stack_fffffffffffffc88);
    local_148 = (PhysicalIndex *)
                ::std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::end
                          ((vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_> *)
                           in_stack_fffffffffffffc78);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<duckdb::PhysicalIndex_*,_std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>_>
                        *)in_stack_fffffffffffffc80,
                       (__normal_iterator<duckdb::PhysicalIndex_*,_std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>_>
                        *)in_stack_fffffffffffffc78);
    if (bVar2) break;
    in_stack_fffffffffffffcf0 = (Binder *)in_stack_00000008.ptr;
    local_1a0 = (idx_t)ColumnDefinition::Physical(in_stack_fffffffffffffc78);
    ::std::vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>::push_back
              ((vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_> *)
               in_stack_fffffffffffffc80,(value_type *)in_stack_fffffffffffffc78);
    in_stack_fffffffffffffce8 =
         &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)in_stack_fffffffffffffc80)->super_BaseExpression;
    in_stack_fffffffffffffce7 = BaseExpression::GetExpressionType(in_stack_fffffffffffffce8);
    if (in_stack_fffffffffffffce7 == VALUE_DEFAULT) {
      in_stack_fffffffffffffcd0 = (ColumnBinding *)(local_18 + 0x28);
      in_stack_fffffffffffffcd8 = ColumnDefinition::Type(local_d0);
      make_uniq<duckdb::BoundDefaultExpression,duckdb::LogicalType_const&>
                (in_stack_fffffffffffffcb8);
      unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
      unique_ptr<duckdb::BoundDefaultExpression,std::default_delete<std::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>>>,void>
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffffc80,
                 (unique_ptr<duckdb::BoundDefaultExpression,_std::default_delete<duckdb::BoundDefaultExpression>_>
                  *)in_stack_fffffffffffffc78);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::push_back((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)in_stack_fffffffffffffc80,(value_type *)in_stack_fffffffffffffc78);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 0xdecef3);
      unique_ptr<duckdb::BoundDefaultExpression,_std::default_delete<duckdb::BoundDefaultExpression>,_true>
      ::~unique_ptr((unique_ptr<duckdb::BoundDefaultExpression,_std::default_delete<duckdb::BoundDefaultExpression>,_true>
                     *)0xdecf00);
    }
    else {
      UpdateBinder::UpdateBinder
                ((UpdateBinder *)in_stack_fffffffffffffc90._M_current,in_stack_fffffffffffffc88,
                 (ClientContext *)in_stack_fffffffffffffc80);
      ColumnDefinition::Type(local_d0);
      LogicalType::operator=
                ((LogicalType *)in_stack_fffffffffffffc88,(LogicalType *)in_stack_fffffffffffffc80);
      in_stack_fffffffffffffcb8 = local_78;
      optional_ptr<duckdb::LogicalType,_true>::optional_ptr
                ((optional_ptr<duckdb::LogicalType,_true> *)(local_230 + 8),(LogicalType *)0x0);
      ExpressionBinder::Bind
                (unaff_retaddr,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)expr_00._M_head_impl,in_stack_00000008,SUB81((ulong)in_RSI >> 0x38,0));
      PlanSubqueries(in_stack_fffffffffffffcf0,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)in_stack_fffffffffffffce8,
                     (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                      *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)in_stack_fffffffffffffc80);
      table_00 = local_38;
      in_stack_fffffffffffffc98._M_current = (PhysicalIndex *)&pEVar6->return_type;
      sVar3 = ::std::
              vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ::size(local_50);
      ColumnBinding::ColumnBinding((ColumnBinding *)(local_260 + 0x18),table_00,sVar3);
      make_uniq<duckdb::BoundColumnRefExpression,duckdb::LogicalType&,duckdb::ColumnBinding>
                (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
      in_stack_fffffffffffffc90._M_current = (PhysicalIndex *)local_230;
      unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
      unique_ptr<duckdb::BoundColumnRefExpression,std::default_delete<std::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>>>,void>
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffffc80,
                 (unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
                  *)in_stack_fffffffffffffc78);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::push_back((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)in_stack_fffffffffffffc80,(value_type *)in_stack_fffffffffffffc78);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 0xded09c);
      unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
      ::~unique_ptr((unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                     *)0xded0a9);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::push_back((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)in_stack_fffffffffffffc80,(value_type *)in_stack_fffffffffffffc78);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 0xded0cd);
      UpdateBinder::~UpdateBinder((UpdateBinder *)0xded0da);
    }
    local_58 = local_58 + 1;
  }
  local_191 = 1;
  uVar4 = __cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_168,"Multiple assignments to same column \"%s\"",&local_169);
  ::std::__cxx11::string::string(local_190,(string *)local_60);
  BinderException::BinderException<std::__cxx11::string>
            ((BinderException *)in_stack_fffffffffffffcf0,(string *)in_stack_fffffffffffffce8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
  local_191 = 0;
  __cxa_throw(uVar4,&BinderException::typeinfo,BinderException::~BinderException);
}

Assistant:

unique_ptr<LogicalOperator> Binder::BindUpdateSet(LogicalOperator &op, unique_ptr<LogicalOperator> root,
                                                  UpdateSetInfo &set_info, TableCatalogEntry &table,
                                                  vector<PhysicalIndex> &columns) {
	auto proj_index = GenerateTableIndex();

	vector<unique_ptr<Expression>> projection_expressions;
	D_ASSERT(set_info.columns.size() == set_info.expressions.size());
	for (idx_t i = 0; i < set_info.columns.size(); i++) {
		auto &colname = set_info.columns[i];
		auto &expr = set_info.expressions[i];
		if (!table.ColumnExists(colname)) {
			throw BinderException("Referenced update column %s not found in table!", colname);
		}
		auto &column = table.GetColumn(colname);
		if (column.Generated()) {
			throw BinderException("Cant update column \"%s\" because it is a generated column!", column.Name());
		}
		if (std::find(columns.begin(), columns.end(), column.Physical()) != columns.end()) {
			throw BinderException("Multiple assignments to same column \"%s\"", colname);
		}
		columns.push_back(column.Physical());
		if (expr->GetExpressionType() == ExpressionType::VALUE_DEFAULT) {
			op.expressions.push_back(make_uniq<BoundDefaultExpression>(column.Type()));
		} else {
			UpdateBinder binder(*this, context);
			binder.target_type = column.Type();
			auto bound_expr = binder.Bind(expr);
			PlanSubqueries(bound_expr, root);

			op.expressions.push_back(make_uniq<BoundColumnRefExpression>(
			    bound_expr->return_type, ColumnBinding(proj_index, projection_expressions.size())));
			projection_expressions.push_back(std::move(bound_expr));
		}
	}
	if (op.type != LogicalOperatorType::LOGICAL_UPDATE && projection_expressions.empty()) {
		return root;
	}
	// now create the projection
	auto proj = make_uniq<LogicalProjection>(proj_index, std::move(projection_expressions));
	proj->AddChild(std::move(root));
	return unique_ptr_cast<LogicalProjection, LogicalOperator>(std::move(proj));
}